

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

int SSL_set1_sigalgs(SSL *ssl,int *values,size_t num_values)

{
  bool bVar1;
  int iVar2;
  unsigned_short *puVar3;
  size_t sVar4;
  undefined1 local_38 [8];
  Array<unsigned_short> sigalgs;
  size_t num_values_local;
  int *values_local;
  SSL *ssl_local;
  
  sigalgs.size_ = num_values;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
  if (!bVar1) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x2af);
    return 0;
  }
  bssl::Array<unsigned_short>::Array((Array<unsigned_short> *)local_38);
  bVar1 = parse_sigalg_pairs((Array<unsigned_short> *)local_38,values,sigalgs.size_);
  if (bVar1) {
    puVar3 = bssl::Array<unsigned_short>::data((Array<unsigned_short> *)local_38);
    sVar4 = bssl::Array<unsigned_short>::size((Array<unsigned_short> *)local_38);
    iVar2 = SSL_set_signing_algorithm_prefs(ssl,puVar3,sVar4);
    if (iVar2 != 0) {
      puVar3 = bssl::Array<unsigned_short>::data((Array<unsigned_short> *)local_38);
      sVar4 = bssl::Array<unsigned_short>::size((Array<unsigned_short> *)local_38);
      iVar2 = SSL_set_verify_algorithm_prefs(ssl,puVar3,sVar4);
      if (iVar2 != 0) {
        ssl_local._4_4_ = 1;
        goto LAB_001b318d;
      }
    }
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = 0;
  }
LAB_001b318d:
  bssl::Array<unsigned_short>::~Array((Array<unsigned_short> *)local_38);
  return ssl_local._4_4_;
}

Assistant:

int SSL_set1_sigalgs(SSL *ssl, const int *values, size_t num_values) {
  if (!ssl->config) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  Array<uint16_t> sigalgs;
  if (!parse_sigalg_pairs(&sigalgs, values, num_values)) {
    return 0;
  }

  if (!SSL_set_signing_algorithm_prefs(ssl, sigalgs.data(), sigalgs.size()) ||
      !SSL_set_verify_algorithm_prefs(ssl, sigalgs.data(), sigalgs.size())) {
    return 0;
  }

  return 1;
}